

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m2v_L_invmult_inplace_p(m2v *LU,int rank,m2v *X_inout,int *placements)

{
  long in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  int pj;
  int j;
  int pi;
  int i;
  undefined4 in_stack_ffffffffffffffc0;
  int c;
  int alpha;
  int r;
  int iVar1;
  int iVar2;
  int local_24;
  
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    r = local_24;
    if (in_RCX != 0) {
      r = *(int *)(in_RCX + (long)local_24 * 4);
    }
    for (iVar2 = 0; iVar2 < local_24; iVar2 = iVar2 + 1) {
      c = iVar2;
      if (in_RCX != 0) {
        c = *(int *)(in_RCX + (long)iVar2 * 4);
      }
      alpha = c;
      iVar1 = c;
      m2v_get_el((m2v *)CONCAT44(iVar2,c),r,c);
      m2v_multadd_row((m2v *)CONCAT44(iVar2,iVar1),r,alpha,
                      (m2v *)CONCAT44(c,in_stack_ffffffffffffffc0),(int)((ulong)in_RDX >> 0x20));
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_L_invmult_inplace_p)(const MV_GEN_TYPE* LU,
				int rank,
				MV_GEN_TYPE* X_inout,
				const int* placements)
{
	/* Apply L^(-1) */
	for (int i = 0; i < rank; ++i) {
		const int pi = (placements ? placements[i] : i);
		for (int j = 0; j < i; ++j) {
			const int pj = (placements ? placements[j] : j);
			MV_GEN_N(_multadd_row)(X_inout, pj,
					MV_GEN_N(_get_el)(LU, i, j),
					X_inout, pi);
		}
	}
}